

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O0

void __thiscall
arangodb::velocypack::HexDump::HexDump
          (HexDump *this,Slice slice,int valuesPerLine,string *separator,string *header)

{
  uint8_t *puVar1;
  ValueLength VVar2;
  undefined4 in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> local_8 [8];
  
  this_00 = local_8;
  this_01 = in_RDI;
  puVar1 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::start
                     ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                      0x103f75);
  (in_RDI->_M_dataplus)._M_p = (pointer)puVar1;
  VVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize(this_00);
  in_RDI->_M_string_length = VVar2;
  *(undefined4 *)&in_RDI->field_2 = in_EDX;
  std::__cxx11::string::string
            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::__cxx11::string::string
            (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

HexDump(Slice slice, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(slice.start()),
        length(slice.byteSize()),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}